

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O0

void __thiscall SensorBase::resume_worker(SensorBase *this)

{
  FILE *__stream;
  int iVar1;
  value_type *pvVar2;
  SensorBase *this_local;
  
  std::
  vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>_>_>
  ::clear(&this->enabled_scan_elem);
  (**this->_vptr_SensorBase)();
  (*this->_vptr_SensorBase[1])();
  enable_buffer(this);
  pvVar2 = std::filesystem::__cxx11::path::c_str(&this->devbufpath);
  iVar1 = open(pvVar2,0);
  this->devfd = iVar1;
  __stream = _stderr;
  if (this->devfd == -1) {
    pvVar2 = std::filesystem::__cxx11::path::c_str(&this->devbufpath);
    fprintf(__stream,"%c: failed to open the iio buffer device: %s\n",0x45,pvVar2);
  }
  else {
    this->paused = 0;
    std::mutex::unlock(&this->read_m);
  }
  return;
}

Assistant:

void SensorBase::resume_worker()
{
	enabled_scan_elem.clear();
	enable_scan_elements();
	update_values();
	enable_buffer();
	devfd=open(devbufpath.c_str(),O_RDONLY);
	if(!~devfd)
		return (void)LOG('E',"failed to open the iio buffer device: %s",devbufpath.c_str());
	paused=0;
	read_m.unlock();
}